

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

int find_symbol(Grammar *g,char *s,char *e,int kind)

{
  int iVar1;
  ushort **ppuVar2;
  Production *pPVar3;
  size_t sVar4;
  bool bVar5;
  uint local_40;
  uint local_3c;
  int found;
  uint i;
  Production *p;
  int kind_local;
  char *e_local;
  char *s_local;
  Grammar *g_local;
  
  e_local = s;
  while( true ) {
    bVar5 = false;
    if (*e_local != '\0') {
      ppuVar2 = __ctype_b_loc();
      bVar5 = ((*ppuVar2)[(int)(uint)(byte)*e_local] & 0x2000) != 0;
    }
    if (!bVar5) break;
    e_local = e_local + 1;
  }
  if (e_local < e) {
    if (kind == 1) {
      pPVar3 = lookup_production(g,e_local,(int)e - (int)e_local);
      if (pPVar3 != (Production *)0x0) {
        return pPVar3->index;
      }
    }
    else if (kind == 4) {
      local_40 = 0xffffffff;
      for (local_3c = 0; local_3c < (g->terminals).n; local_3c = local_3c + 1) {
        if (((g->terminals).v[local_3c]->kind == TERM_STRING) &&
           (((((g->terminals).v[local_3c]->term_name != (char *)0x0 &&
              (sVar4 = strlen((g->terminals).v[local_3c]->term_name),
              sVar4 == (long)e - (long)e_local)) &&
             (iVar1 = strncmp(e_local,(g->terminals).v[local_3c]->term_name,(long)e - (long)e_local)
             , iVar1 == 0)) ||
            ((((g->terminals).v[local_3c]->term_name == (char *)0x0 &&
              ((long)(g->terminals).v[local_3c]->string_len == (long)e - (long)e_local)) &&
             (iVar1 = strncmp(e_local,(g->terminals).v[local_3c]->string,(long)e - (long)e_local),
             iVar1 == 0)))))) {
          if ((int)local_40 < 1) {
            local_40 = local_3c;
          }
          else {
            d_fail("attempt to find symbol for non-unique string \'%s\'\n",
                   (g->terminals).v[local_3c]->string);
          }
        }
      }
      if (0 < (int)local_40) {
        return local_40 + (g->productions).n;
      }
    }
  }
  return -1;
}

Assistant:

static int find_symbol(Grammar *g, char *s, char *e, int kind) {
  while (*s && isspace_(*s)) s++;
  if (e > s) {
    if (kind == D_SYMBOL_NTERM) {
      Production *p;
      if ((p = lookup_production(g, s, e - s))) return p->index;
    } else if (kind == D_SYMBOL_STRING) {
      uint i;
      int found = -1;
      for (i = 0; i < g->terminals.n; i++)
        if (g->terminals.v[i]->kind == TERM_STRING &&
            ((g->terminals.v[i]->term_name && strlen(g->terminals.v[i]->term_name) == (size_t)(e - s) &&
              !strncmp(s, g->terminals.v[i]->term_name, e - s)) ||
             (!g->terminals.v[i]->term_name && g->terminals.v[i]->string_len == (e - s) &&
              !strncmp(s, g->terminals.v[i]->string, e - s)))) {
          if (found > 0) {
            d_fail("attempt to find symbol for non-unique string '%s'\n", g->terminals.v[i]->string);
          } else
            found = i;
        }
      if (found > 0) return found + g->productions.n;
    }
  }
  return -1;
}